

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O1

bool anon_unknown.dwarf_2c8bc::push_pull(EmulateRegisters *regs,Operation op)

{
  byte bVar1;
  Pointer PVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  memoryAccessFunc p_Var6;
  uint uVar7;
  uint8_t uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  ulong uVar13;
  
  switch(op) {
  case PHA:
    uVar3 = regs->_A;
    uVar7 = (uint)uVar3;
    if ((regs->_P & 0x20) != 0) goto LAB_0012e5f2;
    uVar4 = regs->_S;
    goto LAB_0012e704;
  case PHB:
    regs->used_DB = true;
    uVar8 = regs->_DB;
    uVar3 = regs->_S;
    if (regs->_write_function != (memoryAccessFunc)0x0) {
      PVar2 = (Pointer)((ulong)uVar3 | 0x7e0000);
      (*regs->_write_function)(regs->_callback_context,PVar2,PVar2,(uint32_t)uVar8,1,STACK_RELATIVE)
      ;
    }
    regs->_memory[(ulong)uVar3 | 0x7e0000] = uVar8;
    goto LAB_0012e992;
  case PHD:
    regs->used_DP = true;
    uVar3 = regs->_DP;
    goto LAB_0012e6f2;
  case PHK:
    uVar7 = regs->_PC >> 0x10;
LAB_0012e5f2:
    uVar8 = (uint8_t)uVar7;
    uVar3 = regs->_S;
    uVar13 = (ulong)uVar3 | 0x7e0000;
    p_Var6 = regs->_write_function;
    if (p_Var6 != (memoryAccessFunc)0x0) {
      pvVar12 = regs->_callback_context;
LAB_0012e976:
      uVar8 = (uint8_t)uVar7;
      (*p_Var6)(pvVar12,(Pointer)uVar13,(Pointer)uVar13,uVar7 & 0xff,1,STACK_RELATIVE);
    }
    goto LAB_0012e98a;
  case PHP:
    uVar7 = (uint)regs->_P;
LAB_0012e956:
    uVar8 = (uint8_t)uVar7;
    uVar3 = regs->_S;
    uVar13 = (ulong)uVar3 | 0x7e0000;
    p_Var6 = regs->_write_function;
    if (p_Var6 != (memoryAccessFunc)0x0) {
      pvVar12 = regs->_callback_context;
      goto LAB_0012e976;
    }
LAB_0012e98a:
    regs->_memory[uVar13] = uVar8;
LAB_0012e992:
    regs->_S = uVar3 - 1;
    break;
  case PHX:
    if ((regs->_P & 0x10) != 0) {
      *(undefined1 *)&regs->used_X_mask = 0xff;
      uVar7 = (uint)regs->_X;
      goto LAB_0012e956;
    }
    regs->used_X_mask = 0xffff;
    uVar3 = regs->_X;
    goto LAB_0012e6f2;
  case PHY:
    if ((regs->_P & 0x10) != 0) {
      *(undefined1 *)&regs->used_Y_mask = 0xff;
      uVar7 = (uint)regs->_Y;
      goto LAB_0012e956;
    }
    regs->used_Y_mask = 0xffff;
    uVar3 = regs->_Y;
LAB_0012e6f2:
    uVar4 = regs->_S;
LAB_0012e704:
    snestistics::EmulateRegisters::write_word(regs,uVar4 - 1 | 0x7e0000,uVar3,STACK_RELATIVE);
    regs->_S = uVar4 - 2;
    break;
  case PLA:
    uVar3 = regs->_P;
    if ((uVar3 & 0x20) == 0) {
      uVar4 = regs->_S + 2;
      regs->_S = uVar4;
      uVar11 = uVar4 - 1;
      uVar10 = uVar11 & 0xffffff | 0x7e0000;
      uVar5 = *(ushort *)(regs->_memory + uVar10);
      uVar4 = 0xffff;
      uVar7 = (uint)uVar5;
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar11 | 0x7e0000,uVar10,(uint32_t)uVar5,2,STACK_RELATIVE
                  );
        uVar7 = (uint)uVar5;
      }
    }
    else {
      uVar4 = regs->_S + 1;
      regs->_S = uVar4;
      uVar7 = (uint)regs->_memory[(ulong)uVar4 + 0x7e0000];
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar4 | 0x7e0000,uVar4 | 0x7e0000,
                   (uint32_t)regs->_memory[(ulong)uVar4 + 0x7e0000],1,STACK_RELATIVE);
      }
      uVar4 = 0xff;
    }
    uVar9 = (ushort)uVar7;
    uVar5 = (ushort)(uVar9 == 0) * 2;
    if ((uVar3 & 0x20) == 0) {
      uVar5 = uVar5 | (ushort)(uVar7 >> 8) & 0x80;
    }
    else if (0x7f < uVar9) {
      uVar5 = uVar5 + 0x80;
    }
    regs->_P = uVar5 | regs->_P & 0xff7d;
    regs->_A = (uVar9 ^ regs->_A) & uVar4 ^ regs->_A;
    break;
  case PLB:
    uVar7 = *(int *)&regs->_S + 1;
    regs->_S = (uint16_t)uVar7;
    uVar7 = uVar7 & 0xffff;
    bVar1 = regs->_memory[(ulong)uVar7 + 0x7e0000];
    if (regs->_read_function != (memoryAccessFunc)0x0) {
      uVar7 = uVar7 | 0x7e0000;
      (*regs->_read_function)(regs->_callback_context,uVar7,uVar7,(uint32_t)bVar1,1,STACK_RELATIVE);
    }
    regs->_P = regs->_P & 0xff7d | (bVar1 & 0xff80) + (ushort)(bVar1 == 0) * 2;
    regs->_DB = bVar1;
    break;
  case PLD:
    uVar7 = *(int *)&regs->_S + 2;
    regs->_S = (uint16_t)uVar7;
    uVar10 = (uVar7 & 0xffff) - 1;
    uVar7 = uVar10 & 0xffffff | 0x7e0000;
    uVar3 = *(ushort *)(regs->_memory + uVar7);
    if (regs->_read_function != (memoryAccessFunc)0x0) {
      (*regs->_read_function)
                (regs->_callback_context,uVar10 | 0x7e0000,uVar7,(uint32_t)uVar3,2,STACK_RELATIVE);
    }
    regs->_P = regs->_P & 0xff7d | (uVar3 >> 8 & 0x80) + (ushort)(uVar3 == 0) * 2;
    regs->_DP = uVar3;
    break;
  case PLP:
    uVar7 = *(int *)&regs->_S + 1;
    regs->_S = (uint16_t)uVar7;
    uVar7 = uVar7 & 0xffff;
    bVar1 = regs->_memory[(ulong)uVar7 + 0x7e0000];
    if (regs->_read_function != (memoryAccessFunc)0x0) {
      uVar7 = uVar7 | 0x7e0000;
      (*regs->_read_function)(regs->_callback_context,uVar7,uVar7,(uint32_t)bVar1,1,STACK_RELATIVE);
    }
    *(byte *)&regs->_P = bVar1;
    if ((bVar1 & 0x10) != 0) {
      *(undefined1 *)((long)&regs->_X + 1) = 0;
      *(undefined1 *)((long)&regs->_Y + 1) = 0;
    }
    break;
  case PLX:
    if ((regs->_P & 0x10) == 0) {
      uVar3 = regs->_S + 2;
      regs->_S = uVar3;
      uVar10 = uVar3 - 1;
      uVar7 = uVar10 & 0xffffff | 0x7e0000;
      uVar3 = *(ushort *)(regs->_memory + uVar7);
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar10 | 0x7e0000,uVar7,(uint32_t)uVar3,2,STACK_RELATIVE)
        ;
      }
      regs->_P = regs->_P & 0xff7d | (uVar3 >> 8 & 0x80) + (ushort)(uVar3 == 0) * 2;
      regs->_X = uVar3;
    }
    else {
      uVar3 = regs->_S + 1;
      regs->_S = uVar3;
      bVar1 = regs->_memory[(ulong)uVar3 + 0x7e0000];
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar3 | 0x7e0000,uVar3 | 0x7e0000,(uint32_t)bVar1,1,
                   STACK_RELATIVE);
      }
      regs->_P = regs->_P & 0xff7d | (bVar1 & 0xff80) + (ushort)(bVar1 == 0) * 2;
      *(byte *)&regs->_X = bVar1;
    }
    break;
  case PLY:
    if ((regs->_P & 0x10) == 0) {
      uVar3 = regs->_S + 2;
      regs->_S = uVar3;
      uVar10 = uVar3 - 1;
      uVar7 = uVar10 & 0xffffff | 0x7e0000;
      uVar3 = *(ushort *)(regs->_memory + uVar7);
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar10 | 0x7e0000,uVar7,(uint32_t)uVar3,2,STACK_RELATIVE)
        ;
      }
      regs->_P = regs->_P & 0xff7d | (uVar3 >> 8 & 0x80) + (ushort)(uVar3 == 0) * 2;
      regs->_Y = uVar3;
    }
    else {
      uVar3 = regs->_S + 1;
      regs->_S = uVar3;
      bVar1 = regs->_memory[(ulong)uVar3 + 0x7e0000];
      if (regs->_read_function != (memoryAccessFunc)0x0) {
        (*regs->_read_function)
                  (regs->_callback_context,uVar3 | 0x7e0000,uVar3 | 0x7e0000,(uint32_t)bVar1,1,
                   STACK_RELATIVE);
      }
      regs->_P = regs->_P & 0xff7d | (bVar1 & 0xff80) + (ushort)(bVar1 == 0) * 2;
      *(byte *)&regs->_Y = bVar1;
    }
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

inline bool push_pull(EmulateRegisters &regs, const Operation op) {
	// Pushes does not set any flags
	// Most pulls set nz

	if (op == Operation::PHA) {
		if (memory16(regs)) {
			push_word_stack(regs, regs.A());
		} else {
			push_byte_stack(regs, (uint8_t)regs.A(0xFF));
		}
	} else if (op == Operation::PHB) {
		push_byte_stack(regs, regs.DB());
	} else if (op == Operation::PHD) {
		push_word_stack(regs, regs.DP());
	} else if (op == Operation::PHK) {
		push_byte_stack(regs, regs.PC(0xFF0000)>>16);
	} else if (op == Operation::PHP) {
		push_byte_stack(regs, (uint8_t)regs.P(0xFF));	
	} else if (op == Operation::PHX) {
		if (index16(regs)) {
			push_word_stack(regs, regs.X());
		} else {
			push_byte_stack(regs, (uint8_t)regs.X(0xFF));
		}
	} else if (op == Operation::PHY) {
		if (index16(regs)) {
			push_word_stack(regs, regs.Y());
		} else {
			push_byte_stack(regs, (uint8_t)regs.Y(0xFF));
		}
	} else if (op == Operation::PLA) {
		bool wide = memory16(regs);
		uint16_t value = wide ? pop_word_stack(regs) : pop_byte_stack(regs);
		regs.set_A(set_nz_flags(regs, value, wide), wide ? 0xFFFF : 0xFF);
	} else if (op == Operation::PLB) {
		uint8_t value = pop_byte_stack(regs);
		regs.set_DB((uint8_t)set_nz_flags(regs, value, false));
	} else if (op == Operation::PLD) {
		uint16_t value = pop_word_stack(regs);
		regs.set_DP(set_nz_flags(regs, value, true));
	} else if (op == Operation::PLP) {
		uint8_t value = pop_byte_stack(regs);
		regs.set_P(set_nz_flags(regs, value, false), 0xFF);
		// TODO: Can PLP affect emulation bit?
		if (!index16(regs)) {
			regs.set_X(0, 0xFF00);
			regs.set_Y(0, 0xFF00);
		}
	} else if (op == Operation::PLX) {
		if (index16(regs)) {
			uint16_t value = pop_word_stack(regs);
			regs.set_X(set_nz_flags(regs, value, true));
		} else {
			uint8_t value = pop_byte_stack(regs);
			regs.set_X(set_nz_flags(regs, value, false), 0xFF);
		}
	} else if (op == Operation::PLY) {
		if (index16(regs)) {
			uint16_t value = pop_word_stack(regs);
			regs.set_Y(set_nz_flags(regs, value, true));
		} else {
			uint8_t value = pop_byte_stack(regs);
			regs.set_Y(set_nz_flags(regs, value, false), 0xFF);
		}
	} else {
		// Not push-pull
		return false;
	}
	// We handled it!
	return true;
}